

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

bool vkt::shaderexecutor::contains<tcu::Matrix<float,2,3>>(IVal *ival,Matrix<float,_2,_3> *value)

{
  bool bVar1;
  Matrix<float,_2,_3> *value_local;
  IVal *ival_local;
  
  bVar1 = ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doContains
                    (ival,value);
  return bVar1;
}

Assistant:

bool contains (const typename Traits<T>::IVal& ival, const T& value)
{
	return Traits<T>::doContains(ival, value);
}